

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O1

void __thiscall smf::MidiFile::sortTracks(MidiFile *this)

{
  pointer ppMVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (this->m_theTimeState != 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Warning: Sorting only allowed in absolute tick mode.",0x34);
    return;
  }
  ppMVar1 = (this->m_events).
            super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar2 = (long)(this->m_events).
                super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)ppMVar1;
  if (0 < (int)(uVar2 >> 3)) {
    uVar3 = 0;
    do {
      if ((ulong)((long)uVar2 >> 3) <= uVar3) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar3
                  );
      }
      MidiEventList::sort(ppMVar1[uVar3]);
      uVar3 = uVar3 + 1;
      ppMVar1 = (this->m_events).
                super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar2 = (long)(this->m_events).
                    super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)ppMVar1;
    } while ((long)uVar3 < (long)(int)(uVar2 >> 3));
  }
  return;
}

Assistant:

void MidiFile::sortTracks(void) {
	if (m_theTimeState == TIME_STATE_ABSOLUTE) {
		for (int i=0; i<getTrackCount(); i++) {
			m_events.at(i)->sort();
		}
	} else {
		std::cerr << "Warning: Sorting only allowed in absolute tick mode.";
	}
}